

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O2

void __thiscall
amrex::MLCellLinOp::BndryCondLoc::BndryCondLoc
          (BndryCondLoc *this,BoxArray *ba,DistributionMapping *dm,int ncomp)

{
  int iVar1;
  int *piVar2;
  size_type __new_size;
  pointer pGVar3;
  MFIter mfi;
  MFIter local_90;
  
  LayoutData<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>
  ::LayoutData(&this->bcond,ba,dm);
  LayoutData<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>::
  LayoutData(&this->bcloc,ba,dm);
  LayoutData<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*>::LayoutData(&this->bctl,ba,dm);
  PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
  ::PODVector(&this->bctl_dv,
              (long)((int)((ulong)((long)*(pointer *)
                                          ((long)&(this->bctl).super_FabArrayBase.indexArray.
                                                  super_vector<int,_std::allocator<int>_>.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + 8) -
                                  (long)(this->bctl).super_FabArrayBase.indexArray.
                                        super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2) * ncomp));
  this->m_ncomp = ncomp;
  pGVar3 = (this->bctl_dv).m_data;
  MFIter::MFIter(&local_90,&(this->bcloc).super_FabArrayBase,'\0');
  __new_size = (size_type)ncomp;
  while (local_90.currentIndex < local_90.endIndex) {
    iVar1 = local_90.currentIndex;
    if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      iVar1 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [local_90.currentIndex];
    }
    std::
    vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>::
    resize(&(this->bcond).m_data.
            super_vector<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>_>
            .
            super__Vector_base<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar1].
            super_vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
           ,__new_size);
    piVar2 = &local_90.currentIndex;
    if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar2 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + local_90.currentIndex;
    }
    std::vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>::resize
              (&(this->bcloc).m_data.
                super_vector<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>_>
                .
                super__Vector_base<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[*piVar2].
                super_vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>,
               __new_size);
    piVar2 = &local_90.currentIndex;
    if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar2 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + local_90.currentIndex;
    }
    (this->bctl).m_data.
    super_vector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*>_>
    .
    super__Vector_base<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*>_>
    ._M_impl.super__Vector_impl_data._M_start[*piVar2] = pGVar3;
    MFIter::operator++(&local_90);
    pGVar3 = pGVar3 + __new_size;
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

MLCellLinOp::BndryCondLoc::BndryCondLoc (const BoxArray& ba, const DistributionMapping& dm, int ncomp)
    : bcond(ba, dm),
      bcloc(ba, dm),
      bctl(ba, dm),
      bctl_dv(bctl.local_size()*ncomp),
      m_ncomp(ncomp)
{
    auto dp = bctl_dv.data();
    for (MFIter mfi(bcloc); mfi.isValid(); ++mfi) {
        bcond[mfi].resize(ncomp);
        bcloc[mfi].resize(ncomp);
        bctl[mfi] = dp;
        dp += ncomp;
    }
}